

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

bool v_scroll_on_left_form_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value *pAVar3;
  Am_Value local_48 [2];
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Value value;
  Am_Object *self_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)self;
  Am_Value::Am_Value((Am_Value *)local_20);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)value.value.long_value,(ulong)R5);
  Am_Object::Am_Object(&local_28,pAVar2);
  pAVar3 = Am_Object::Peek(&local_28,0x169,0);
  Am_Value::operator=((Am_Value *)local_20,(Am_Value *)pAVar3);
  Am_Object::~Am_Object(&local_28);
  Am_Value::Am_Value(local_48,(Am_Value *)local_20);
  bVar1 = find_in_list(local_48,0xc);
  Am_Value::~Am_Value(local_48);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, v_scroll_on_left_form)
{
  Am_Value value;
  value = Am_Object(self.Get(R5)).Peek(Am_VALUE);
  return find_in_list(value, V_ON_LEFT);
}